

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom parse_ident(JSParseState *s,uint8_t **pp,BOOL *pident_has_escape,int c,BOOL is_private)

{
  byte *pbVar1;
  byte bVar2;
  JSRuntime *pJVar3;
  int iVar4;
  JSAtom JVar5;
  ulong len;
  byte *p;
  bool bVar6;
  char *buf;
  uint8_t *p1;
  size_t ident_size;
  char ident_buf [128];
  char *local_e0;
  byte *local_d8;
  JSParseState *local_d0;
  size_t local_c8;
  uint8_t **local_c0;
  char local_b8 [136];
  
  local_e0 = local_b8;
  local_c8 = 0x80;
  if (is_private != 0) {
    local_b8[0] = '#';
  }
  len = (ulong)(is_private != 0);
  p = *pp;
  local_d0 = s;
  local_c0 = pp;
  while( true ) {
    if (c < 0x80) {
      local_e0[len] = (char)c;
      len = len + 1;
      local_d8 = p;
    }
    else {
      local_d8 = p;
      iVar4 = unicode_to_utf8((uint8_t *)(local_e0 + len),c);
      len = len + (long)iVar4;
    }
    pbVar1 = local_d8 + 1;
    bVar2 = *local_d8;
    c = (int)bVar2;
    local_d8 = pbVar1;
    if ((c == 0x5c) && (*pbVar1 == 0x75)) {
      c = lre_parse_escape(&local_d8,1);
      *pident_has_escape = 1;
    }
    else if ((char)bVar2 < '\0') {
      c = unicode_from_utf8(p,6,&local_d8);
    }
    if ((uint)c < 0x80) {
      bVar6 = (lre_id_continue_table_ascii[(uint)c >> 5] >> (c & 0x1fU) & 1) != 0;
    }
    else {
      iVar4 = lre_is_id_continue(c);
      bVar6 = (c & 0xfffffffeU) == 0x200c || iVar4 != 0;
    }
    if (!bVar6) break;
    p = local_d8;
    if ((local_c8 - 6 <= len) &&
       (iVar4 = ident_realloc(local_d0->ctx,&local_e0,&local_c8,local_b8), iVar4 != 0)) {
      JVar5 = 0;
LAB_00154f29:
      if (local_e0 != local_b8) {
        pJVar3 = local_d0->ctx->rt;
        (*(pJVar3->mf).js_free)(&pJVar3->malloc_state,local_e0);
      }
      *local_c0 = p;
      return JVar5;
    }
  }
  JVar5 = JS_NewAtomLen(local_d0->ctx,local_e0,len);
  goto LAB_00154f29;
}

Assistant:

static JSAtom parse_ident(JSParseState *s, const uint8_t **pp,
                          BOOL *pident_has_escape, int c, BOOL is_private)
{
    const uint8_t *p, *p1;
    char ident_buf[128], *buf;
    size_t ident_size, ident_pos;
    JSAtom atom;
    
    p = *pp;
    buf = ident_buf;
    ident_size = sizeof(ident_buf);
    ident_pos = 0;
    if (is_private)
        buf[ident_pos++] = '#';
    for(;;) {
        p1 = p;
        
        if (c < 128) {
            buf[ident_pos++] = c;
        } else {
            ident_pos += unicode_to_utf8((uint8_t*)buf + ident_pos, c);
        }
        c = *p1++;
        if (c == '\\' && *p1 == 'u') {
            c = lre_parse_escape(&p1, TRUE);
            *pident_has_escape = TRUE;
        } else if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p1);
        }
        if (!lre_js_is_ident_next(c))
            break;
        p = p1;
        if (unlikely(ident_pos >= ident_size - UTF8_CHAR_LEN_MAX)) {
            if (ident_realloc(s->ctx, &buf, &ident_size, ident_buf)) {
                atom = JS_ATOM_NULL;
                goto done;
            }
        }
    }
    atom = JS_NewAtomLen(s->ctx, buf, ident_pos);
 done:
    if (unlikely(buf != ident_buf))
        js_free(s->ctx, buf);
    *pp = p;
    return atom;
}